

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crunch.cpp
# Opt level: O1

bool __thiscall
crunch::process_input_spec(crunch *this,file_desc_vec *files,dynamic_string *input_spec)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  undefined1 this_00 [8];
  long lVar4;
  dynamic_string find_name;
  find_files file_finder;
  dynamic_string find_filename;
  dynamic_string find_pathname;
  dynamic_string find_ext;
  dynamic_string find_fname;
  dynamic_string find_path;
  dynamic_string find_drive;
  dynamic_string dStack_a8;
  undefined1 local_98 [8];
  char *pcStack_90;
  int64 local_88;
  dynamic_string local_78;
  dynamic_string local_68;
  dynamic_string local_58;
  dynamic_string local_48;
  dynamic_string local_38;
  dynamic_string local_28;
  
  crnlib::dynamic_string::dynamic_string(&dStack_a8,input_spec);
  if (dStack_a8.m_len != 0) {
    pcVar3 = dStack_a8.m_pStr;
    if (dStack_a8.m_pStr == (char *)0x0) {
      pcVar3 = "";
    }
    bVar1 = crnlib::file_utils::does_dir_exist(pcVar3);
    if (bVar1) {
      pcVar3 = "";
      if (dStack_a8.m_pStr != (char *)0x0) {
        pcVar3 = dStack_a8.m_pStr;
      }
      crnlib::file_utils::combine_path(&dStack_a8,pcVar3,"*");
    }
  }
  if (dStack_a8.m_len != 0) {
    bVar1 = crnlib::file_utils::full_path(&dStack_a8);
    if (bVar1) {
      bVar1 = crnlib::command_line_params::get_value_as_bool(&this->m_params,"deep",0,false);
      local_28.m_buf_size = 0;
      local_28.m_len = 0;
      local_28.m_pStr = (char *)0x0;
      local_38.m_buf_size = 0;
      local_38.m_len = 0;
      local_38.m_pStr = (char *)0x0;
      local_48.m_buf_size = 0;
      local_48.m_len = 0;
      local_48.m_pStr = (char *)0x0;
      local_58.m_buf_size = 0;
      local_58.m_len = 0;
      local_58.m_pStr = (char *)0x0;
      pcVar3 = dStack_a8.m_pStr;
      if (dStack_a8.m_pStr == (char *)0x0) {
        pcVar3 = "";
      }
      crnlib::file_utils::split_path(pcVar3,&local_28,&local_38,&local_48,&local_58);
      local_68.m_buf_size = 0;
      local_68.m_len = 0;
      local_68.m_pStr = (char *)0x0;
      pcVar3 = local_28.m_pStr;
      if (local_28.m_pStr == (char *)0x0) {
        pcVar3 = "";
      }
      pcVar2 = local_38.m_pStr;
      if (local_38.m_pStr == (char *)0x0) {
        pcVar2 = "";
      }
      crnlib::file_utils::combine_path(&local_68,pcVar3,pcVar2);
      local_78.m_buf_size = 0;
      local_78.m_len = 0;
      local_78.m_pStr = (char *)0x0;
      crnlib::operator+((crnlib *)local_98,&local_48,&local_58);
      crnlib::dynamic_string::set(&local_78,(dynamic_string *)local_98,0xffffffff);
      if ((pcStack_90 != (char *)0x0) &&
         ((*(uint *)(pcStack_90 + -8) ^ *(uint *)(pcStack_90 + -4)) == 0xffffffff)) {
        crnlib::crnlib_free(pcStack_90 + -0x10);
      }
      local_98 = (undefined1  [8])0x0;
      pcStack_90 = (char *)0x0;
      local_88 = 0;
      pcVar3 = local_68.m_pStr;
      if (local_68.m_pStr == (char *)0x0) {
        pcVar3 = "";
      }
      pcVar2 = local_78.m_pStr;
      if (local_78.m_pStr == (char *)0x0) {
        pcVar2 = "";
      }
      bVar1 = crnlib::find_files::find((find_files *)local_98,pcVar3,pcVar2,bVar1 | 4);
      if (bVar1) {
        if ((uint)pcStack_90 == 0) {
          pcVar3 = "";
          if (dStack_a8.m_pStr != (char *)0x0) {
            pcVar3 = dStack_a8.m_pStr;
          }
          crnlib::console::warning("No files found: %s",pcVar3);
        }
        else {
          crnlib::vector<crnlib::find_files::file_desc>::insert
                    (files,files->m_size,(file_desc *)local_98,(uint)pcStack_90);
        }
      }
      else {
        pcVar3 = "";
        if (dStack_a8.m_pStr != (char *)0x0) {
          pcVar3 = dStack_a8.m_pStr;
        }
        crnlib::console::error("Failed finding files: %s",pcVar3);
      }
      if (local_98 != (undefined1  [8])0x0) {
        if (((ulong)pcStack_90 & 0xffffffff) != 0) {
          lVar4 = ((ulong)pcStack_90 & 0xffffffff) * 0x48;
          this_00 = local_98;
          do {
            crnlib::find_files::file_desc::~file_desc((file_desc *)this_00);
            this_00 = (undefined1  [8])((long)this_00 + 0x48);
            lVar4 = lVar4 + -0x48;
          } while (lVar4 != 0);
        }
        crnlib::crnlib_free((void *)local_98);
      }
      if ((local_78.m_pStr != (char *)0x0) &&
         ((*(uint *)(local_78.m_pStr + -8) ^ *(uint *)(local_78.m_pStr + -4)) == 0xffffffff)) {
        crnlib::crnlib_free(local_78.m_pStr + -0x10);
      }
      if ((local_68.m_pStr != (char *)0x0) &&
         ((*(uint *)(local_68.m_pStr + -8) ^ *(uint *)(local_68.m_pStr + -4)) == 0xffffffff)) {
        crnlib::crnlib_free(local_68.m_pStr + -0x10);
      }
      if ((local_58.m_pStr != (char *)0x0) &&
         ((*(uint *)(local_58.m_pStr + -8) ^ *(uint *)(local_58.m_pStr + -4)) == 0xffffffff)) {
        crnlib::crnlib_free(local_58.m_pStr + -0x10);
      }
      if ((local_48.m_pStr != (char *)0x0) &&
         ((*(uint *)(local_48.m_pStr + -8) ^ *(uint *)(local_48.m_pStr + -4)) == 0xffffffff)) {
        crnlib::crnlib_free(local_48.m_pStr + -0x10);
      }
      if ((local_38.m_pStr != (char *)0x0) &&
         ((*(uint *)(local_38.m_pStr + -8) ^ *(uint *)(local_38.m_pStr + -4)) == 0xffffffff)) {
        crnlib::crnlib_free(local_38.m_pStr + -0x10);
      }
      if ((local_28.m_pStr != (char *)0x0) &&
         ((*(uint *)(local_28.m_pStr + -8) ^ *(uint *)(local_28.m_pStr + -4)) == 0xffffffff)) {
        crnlib::crnlib_free(local_28.m_pStr + -0x10);
      }
      goto LAB_0010b7c9;
    }
  }
  pcVar3 = "";
  if (dStack_a8.m_pStr != (char *)0x0) {
    pcVar3 = dStack_a8.m_pStr;
  }
  bVar1 = false;
  crnlib::console::error("Invalid input filename: %s",pcVar3);
LAB_0010b7c9:
  if ((dStack_a8.m_pStr != (char *)0x0) &&
     ((*(uint *)(dStack_a8.m_pStr + -8) ^ *(uint *)(dStack_a8.m_pStr + -4)) == 0xffffffff)) {
    crnlib::crnlib_free(dStack_a8.m_pStr + -0x10);
  }
  return bVar1;
}

Assistant:

bool process_input_spec(find_files::file_desc_vec& files, const dynamic_string& input_spec) {
    dynamic_string find_name(input_spec);

    if ((find_name.get_len()) && (file_utils::does_dir_exist(find_name.get_ptr()))) {
      file_utils::combine_path(find_name, find_name.get_ptr(), "*");
    }

    if ((find_name.is_empty()) || (!file_utils::full_path(find_name))) {
      console::error("Invalid input filename: %s", find_name.get_ptr());
      return false;
    }

    const bool deep_flag = m_params.get_value_as_bool("deep");

    dynamic_string find_drive, find_path, find_fname, find_ext;
    file_utils::split_path(find_name.get_ptr(), &find_drive, &find_path, &find_fname, &find_ext);

    dynamic_string find_pathname;
    file_utils::combine_path(find_pathname, find_drive.get_ptr(), find_path.get_ptr());
    dynamic_string find_filename;
    find_filename = find_fname + find_ext;

    find_files file_finder;
    bool success = file_finder.find(find_pathname.get_ptr(), find_filename.get_ptr(), find_files::cFlagAllowFiles | (deep_flag ? find_files::cFlagRecursive : 0));
    if (!success) {
      console::error("Failed finding files: %s", find_name.get_ptr());
      return false;
    }

    if (file_finder.get_files().empty()) {
      console::warning("No files found: %s", find_name.get_ptr());
      return true;
    }

    files.append(file_finder.get_files());

    return true;
  }